

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.c
# Opt level: O1

void game_run(_func_void *eventpoll,_func_void *draw)

{
  vec2i vVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  cell_type cVar6;
  size_t i;
  time_t tVar7;
  long lVar8;
  vec2i *pvVar9;
  uint uVar10;
  uint uVar12;
  ulong uVar11;
  ulong uVar13;
  
  iVar3 = SDL_GetTicks();
  while( true ) {
    while (g.state == INIT) {
      tVar7 = time((time_t *)0x0);
      srand((uint)tVar7);
      iVar4 = rand();
      g.dir = iVar4 % 4;
      iVar4 = rand();
      iVar4 = iVar4 % ui_cols;
      iVar5 = rand();
      g.food.y = iVar5 % ui_rows;
      g.snake.len = 0;
      g.food.x = iVar4;
      iVar5 = rand();
      iVar4 = ui_cols + 3;
      if (-1 < ui_cols) {
        iVar4 = ui_cols;
      }
      uVar12 = (iVar4 >> 2) + iVar5 % (ui_cols / 2);
      uVar13 = (ulong)uVar12;
      iVar5 = rand();
      iVar4 = ui_rows + 3;
      if (-1 < ui_rows) {
        iVar4 = ui_rows;
      }
      uVar10 = (iVar4 >> 2) + iVar5 % (ui_rows / 2);
      uVar11 = (ulong)uVar10;
      vVar1.y = uVar10;
      vVar1.x = uVar12;
      snake_push(vVar1);
      switch(g.dir) {
      case UP:
        uVar11 = (ulong)(uVar10 + 1);
        break;
      case RIGHT:
        uVar13 = (ulong)(uVar12 - 1);
        break;
      case DOWN:
        uVar11 = (ulong)(uVar10 - 1);
        break;
      case LEFT:
        uVar13 = (ulong)(uVar12 + 1);
        break;
      default:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/iostapyshyn[P]snakerl/game.c"
                      ,0x4a,"void game_init()");
      }
      snake_push((vec2i)(uVar13 | uVar11 << 0x20));
      g.state = MENU;
    }
    if (g.state == QUIT) break;
    (*eventpoll)();
    if (g.state == RUNNING) {
      iVar4 = SDL_GetTicks();
      if ((force_update != '\0') || (levels[g.level].update_ms < (uint)(iVar4 - iVar3))) {
        force_update = '\0';
        vVar1 = g.snake.seg[(long)g.snake.len + -1];
        lVar8 = (long)g.snake.len + -1;
        if ((int)lVar8 != 0) {
          do {
            g.snake.seg[lVar8] = g.snake.seg[lVar8 + -1];
            lVar8 = lVar8 + -1;
          } while (lVar8 != 0);
        }
        pvVar9 = g.snake.seg;
        switch(g.dir) {
        case UP:
          iVar3 = -1;
          pvVar9 = (vec2i *)&(g.snake.seg)->y;
          break;
        case RIGHT:
          iVar3 = 1;
          break;
        case DOWN:
          iVar3 = 1;
          pvVar9 = (vec2i *)&(g.snake.seg)->y;
          break;
        case LEFT:
          iVar3 = -1;
          break;
        default:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/iostapyshyn[P]snakerl/game.c"
                        ,0x60,"void game_update()");
        }
        pvVar9->x = pvVar9->x + iVar3;
        pvVar9 = g.snake.seg;
        cVar6 = cell_gettype(*g.snake.seg);
        if ((cVar6 == WALL) && (cVar6 = WALL, levels[g.level].wall_collisions == false)) {
          iVar3 = pvVar9->x;
          if (iVar3 < 0 || ui_cols <= iVar3) {
            iVar3 = ui_cols + iVar3;
            pvVar9->x = iVar3;
            pvVar9->x = iVar3 % ui_cols;
          }
          iVar3 = pvVar9->y;
          if (iVar3 < 0 || ui_rows <= iVar3) {
            pvVar9->y = (iVar3 + ui_rows) % ui_rows;
          }
          cVar6 = cell_gettype(*pvVar9);
        }
        iVar3 = iVar4;
        if ((cVar6 == SNAKE) || ((cVar6 == WALL && (levels[g.level].wall_collisions != false)))) {
          g.state = LOST;
        }
        else if (cVar6 == FOOD) {
          snake_push(vVar1);
          do {
            iVar4 = rand();
            lVar8 = (long)ui_cols;
            iVar5 = rand();
            lVar2 = (long)ui_rows;
            cVar6 = cell_gettype((vec2i)(((long)iVar4 % lVar8 & 0xffffffffU) +
                                        ((long)iVar5 % lVar2 << 0x20)));
          } while (cVar6 != EMPTY);
          g.food.x = (int32_t)((long)iVar4 % lVar8);
          g.food.y = (int32_t)((long)iVar5 % lVar2);
        }
      }
    }
    else if (g.state == MENU) {
      if (g.level < 3) {
        if (g.level < 0) {
          g.level = 2;
        }
      }
      else {
        g.level = 0;
      }
    }
    (*draw)();
  }
  g.state = QUIT;
  free(g.snake.seg);
  return;
}

Assistant:

void game_run(void (*eventpoll)(void), void (*draw)(void)) {
    uint32_t last_ticks = SDL_GetTicks();
    while (g.state != QUIT) {
        if (g.state == INIT) {
            game_init();
            continue;
        }
        
        eventpoll();

        if (g.state == MENU) {
            if ((signed int) g.level > nlevels-1)
                g.level = 0;
            else if ((signed int) g.level < 0)
                g.level = nlevels-1;
        } else if (g.state == RUNNING) {
            uint32_t now_ticks = SDL_GetTicks();
            if (force_update || now_ticks - last_ticks > levels[g.level].update_ms) {
                /* Update. */
                force_update = false;
                last_ticks = now_ticks;
                game_update();
            }
        }

        draw();
    }

    game_quit();
}